

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O2

void __thiscall google::protobuf::UnknownFieldSet::DeleteByNumber(UnknownFieldSet *this,int number)

{
  UnknownField *this_00;
  pointer pUVar1;
  anon_union_8_5_912831f5_for_data_ aVar2;
  uint32 uVar3;
  uint uVar4;
  long lVar5;
  int i;
  ulong uVar6;
  
  lVar5 = 0;
  uVar6 = 0;
  uVar4 = 0;
  while( true ) {
    pUVar1 = (this->fields_).
             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->fields_).
                      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1 >> 4) <= uVar6)
    break;
    this_00 = (UnknownField *)((long)&pUVar1->number_ + lVar5);
    if (*(int *)((long)&pUVar1->number_ + lVar5) == number) {
      UnknownField::Delete(this_00);
    }
    else {
      if (uVar6 != uVar4) {
        uVar3 = this_00->type_;
        aVar2 = this_00->data_;
        pUVar1 = pUVar1 + (int)uVar4;
        pUVar1->number_ = this_00->number_;
        pUVar1->type_ = uVar3;
        pUVar1->data_ = aVar2;
      }
      uVar4 = uVar4 + 1;
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x10;
  }
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  resize(&this->fields_,(long)(int)uVar4);
  return;
}

Assistant:

void UnknownFieldSet::DeleteByNumber(int number) {
  int left = 0;  // The number of fields left after deletion.
  for (int i = 0; i < fields_.size(); ++i) {
    UnknownField* field = &(fields_)[i];
    if (field->number() == number) {
      field->Delete();
    } else {
      if (i != left) {
        (fields_)[left] = (fields_)[i];
      }
      ++left;
    }
  }
  fields_.resize(left);
}